

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O1

void Col_ListIterBackward(ColListIterator *it,size_t nb)

{
  size_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  Col_Word *pCVar4;
  ulong uVar5;
  
  if (nb != 0) {
    uVar2 = it->length;
    uVar3 = it->index;
    if (uVar3 < uVar2) {
      uVar5 = uVar3 - nb;
      if (uVar3 < nb) {
        (it->chunk).first = 0xffffffffffffffff;
        if (it->list == 0) {
          (it->chunk).last = uVar3;
        }
        it->index = uVar2;
        return;
      }
      it->index = uVar5;
      if (((it->chunk).first <= uVar5) && (uVar5 <= (it->chunk).last)) {
        if ((it->chunk).accessProc != (undefined1 *)0x0) {
          psVar1 = &(it->chunk).current.access.index;
          *psVar1 = *psVar1 - nb;
          return;
        }
        pCVar4 = (it->chunk).current.direct;
        if (pCVar4 != (Col_Word *)0x0) {
          (it->chunk).current.direct = pCVar4 + -nb;
          return;
        }
      }
    }
    else if (nb <= uVar2) {
      if (it->list != 0) {
        it->index = uVar2 - nb;
        return;
      }
      it->index = (it->chunk).last;
      (it->chunk).first = 0;
      (it->chunk).last = uVar2 - 1;
      Col_ListIterMoveTo(it,uVar2 - nb);
      return;
    }
  }
  return;
}

Assistant:

void
Col_ListIterBackward(
    Col_ListIterator it,    /*!< The iterator to move. */
    size_t nb)              /*!< Offset to move backward. */
{
    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_LISTITER,it} */
    TYPECHECK_LISTITER(it) return;

    if (nb == 0) {
        /*
         * No-op.
         */

        return;
    }

    if (Col_ListIterEnd(it)) {
        /*
         * Allow iterators at end to go back.
         */

        if (nb > it->length) {
            /*
             * No-op.
             */

            return;
        }

        if (it->list == WORD_NIL) {
            /* 
             * Array iterator mode, restore previous position and move to the
             * new one (see Col_ListIterForward and below).
             */
            it->index = it->chunk.last;
            it->chunk.first = 0;
            it->chunk.last = it->length-1;
            Col_ListIterMoveTo(it, it->length-nb);
            return;
        }

        it->index = it->length-nb;
        return;
    } else if (it->index < nb) {
        /*
         * Beginning of list, set iterator at end.
         */

        it->chunk.first = SIZE_MAX; /* Invalidate traversal info. */
        if (it->list == WORD_NIL) {
            /* 
             * Array iterator mode, save current index for backward iteration
             * from end (see above).
             */
            it->chunk.last = it->index;
        }
        it->index = it->length;
        return;
    }

    it->index -= nb;
    if (it->index >= it->chunk.first && it->index <= it->chunk.last) {
        /*
         * Update current chunk pointer.
         */

        if (it->chunk.accessProc) it->chunk.current.access.index -= nb;
        else if (it->chunk.current.direct) it->chunk.current.direct -= nb;
    }
}